

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O3

bool aux_positioning_vertical(Board *board,int row,int col,Ship ship)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if (ship.orientation != 'V') {
    return true;
  }
  if (ship.direction == -2) {
    if ((int)(row + 1U) < row - ship.length) {
      return true;
    }
    uVar3 = row + 1U;
    do {
      uVar4 = col - 2;
      do {
        uVar4 = uVar4 + 1;
        if ((((-1 < (int)uVar3) && (-1 < (int)uVar4)) && ((int)uVar3 < board->row)) &&
           (((int)uVar4 < board->column &&
            (iVar2 = std::__cxx11::string::compare
                               ((char *)((ulong)uVar4 * 0x20 +
                                        *(long *)&(board->matrix).
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar2 != 0))))
        {
          return false;
        }
      } while ((int)uVar4 <= col);
      bVar1 = row - ship.length < (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  else {
    if (ship.direction != 2) {
      return true;
    }
    if (ship.length < -1) {
      return true;
    }
    uVar3 = row - 1;
    do {
      uVar4 = col - 2;
      do {
        uVar4 = uVar4 + 1;
        if (((-1 < (int)uVar3) && (-1 < (int)uVar4)) &&
           (((int)uVar3 < board->row &&
            (((int)uVar4 < board->column &&
             (iVar2 = std::__cxx11::string::compare
                                ((char *)((ulong)uVar4 * 0x20 +
                                         *(long *)&(board->matrix).
                                                                                                      
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar2 != 0))))
           )) {
          return false;
        }
      } while ((int)uVar4 <= col);
      bVar1 = (int)uVar3 < ship.length + row;
      uVar3 = uVar3 + 1;
    } while (bVar1);
  }
  return true;
}

Assistant:

bool aux_positioning_vertical( Board *board, int row, int col, Ship ship )
{
    if( ship.orientation == 'V' )
    {
        if( ship.direction == 2 )
        {
            for( int i = row - 1; i <= row + ship.length; i++ )
            {
                for( int j = col - 1; j <= col + 1; j++ )
                {

                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                        continue;
                    }


                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
        else if( ship.direction == -2 )
        {
            for( int i = row + 1; i >= row - ship.length; i-- )
            {
                for( int j = col - 1; j <= col + 1 ; j++ )
                {
                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                       continue;
                    }

                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
    }

    return true;
}